

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O2

HighsStatus __thiscall
FilereaderLp::writeModelToFile
          (FilereaderLp *this,HighsOptions *options,string *filename,HighsModel *model)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  uint var_index;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FILE *__stream;
  pointer piVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  HighsInt iCol;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  HighsInt iCol_2;
  HighsSparseMatrix *ar_matrix_00;
  HighsInt HVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  HighsSparseMatrix ar_matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  HighsSparseMatrix local_2b0;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  HighsSparseMatrix local_180;
  HighsSparseMatrix local_110;
  HighsSparseMatrix local_a0;
  
  HighsSparseMatrix::HighsSparseMatrix(&local_2b0,&(model->lp_).a_matrix_);
  HighsSparseMatrix::ensureRowwise(&local_2b0);
  __x = &(model->lp_).col_names_;
  lVar6 = (long)(model->lp_).col_names_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(model->lp_).col_names_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  lVar7 = (long)(model->lp_).num_col_;
  lVar10 = (long)(model->lp_).row_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->lp_).row_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  lVar8 = (long)(model->lp_).num_row_;
  __stream = fopen((filename->_M_dataplus)._M_p,"w");
  lVar12 = 0;
  writeToFile(this,(FILE *)__stream,"\\ %s","File written by HiGHS .lp file handler");
  writeToFileLineend(this,(FILE *)__stream);
  pcVar11 = "max";
  if ((model->lp_).sense_ == kMinimize) {
    pcVar11 = "min";
  }
  writeToFile(this,(FILE *)__stream,"%s",pcVar11);
  writeToFileLineend(this,(FILE *)__stream);
  writeToFile(this,(FILE *)__stream," obj:");
  for (lVar14 = 0; lVar14 < (model->lp_).num_col_; lVar14 = lVar14 + 1) {
    dVar17 = (model->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar14];
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      writeToFile(this,(FILE *)__stream," %+.15g");
      if (lVar6 == lVar7) {
        std::__cxx11::string::string
                  ((string *)&local_1a0,
                   (string *)
                   ((long)&(((__x->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12
                   ));
        writeToFileVar(this,(FILE *)__stream,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
      }
      else {
        writeToFileVar(this,(FILE *)__stream,(HighsInt)lVar14);
      }
    }
    lVar12 = lVar12 + 0x20;
  }
  writeToFile(this,(FILE *)__stream," ");
  if ((model->hessian_).dim_ != 0) {
    writeToFile(this,(FILE *)__stream,"+ [");
    uVar5 = 0;
    while (uVar16 = uVar5, (long)uVar16 < (long)(model->lp_).num_col_) {
      piVar9 = (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar12 = (long)piVar9[uVar16]; uVar5 = uVar16 + 1, lVar12 < piVar9[uVar16 + 1];
          lVar12 = lVar12 + 1) {
        var_index = (model->hessian_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
        if ((long)uVar16 <= (long)(int)var_index) {
          dVar17 = (model->hessian_).value_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12];
          if (uVar16 != var_index) {
            dVar17 = dVar17 + dVar17;
          }
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            writeToFile(this,(FILE *)__stream," %+.15g");
            if (lVar6 == lVar7) {
              std::__cxx11::string::string
                        ((string *)&local_1c0,
                         (string *)
                         ((__x->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar16));
              writeToFileVar(this,(FILE *)__stream,&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
              writeToFile(this,(FILE *)__stream," *");
              std::__cxx11::string::string
                        ((string *)&local_2d0,
                         (string *)
                         ((__x->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + (int)var_index));
              writeToFileVar(this,(FILE *)__stream,&local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
            }
            else {
              writeToFileVar(this,(FILE *)__stream,(HighsInt)uVar16);
              writeToFile(this,(FILE *)__stream," *");
              writeToFileVar(this,(FILE *)__stream,var_index);
            }
          }
        }
        piVar9 = (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    writeToFile(this,(FILE *)__stream,"  ]/2 ");
  }
  dVar17 = (model->lp_).offset_;
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    writeToFile(this,(FILE *)__stream," %+.15g");
  }
  writeToFileLineend(this,(FILE *)__stream);
  writeToFile(this,(FILE *)__stream,"st");
  writeToFileLineend(this,(FILE *)__stream);
  pvVar1 = &(model->lp_).row_lower_;
  pvVar2 = &(model->lp_).row_upper_;
  lVar12 = 0;
  for (lVar14 = 0; lVar14 < (model->lp_).num_row_; lVar14 = lVar14 + 1) {
    dVar17 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar14];
    dVar18 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar14];
    HVar15 = (HighsInt)lVar14;
    if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
      if (dVar17 == -INFINITY) {
        pcVar11 = ":";
      }
      else {
        if (lVar10 == lVar8) {
          std::__cxx11::string::string
                    ((string *)&local_310,
                     (string *)
                     ((long)&(((model->lp_).row_names_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar12));
          writeToFileVar(this,(FILE *)__stream,&local_310);
          std::__cxx11::string::~string((string *)&local_310);
        }
        else {
          writeToFileCon(this,(FILE *)__stream,HVar15);
        }
        pcVar11 = ":";
        if (dVar18 != INFINITY) {
          pcVar11 = "lo:";
        }
        writeToFile(this,(FILE *)__stream,pcVar11);
        HighsSparseMatrix::HighsSparseMatrix(&local_110,&local_2b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_3a0,__x);
        writeToFileMatrixRow(this,(FILE *)__stream,HVar15,&local_110,&local_3a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3a0);
        HighsSparseMatrix::~HighsSparseMatrix(&local_110);
        writeToFile(this,(FILE *)__stream," >=");
        writeToFile(this,(FILE *)__stream," %+.15g",
                    (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar14]);
        writeToFileLineend(this,(FILE *)__stream);
        bVar4 = dVar18 != INFINITY;
        dVar18 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar14];
        pcVar11 = ":";
        if (bVar4) {
          pcVar11 = "up:";
        }
      }
      if (dVar18 != INFINITY) {
        if (lVar10 == lVar8) {
          std::__cxx11::string::string
                    ((string *)&local_330,
                     (string *)
                     ((long)&(((model->lp_).row_names_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar12));
          writeToFileVar(this,(FILE *)__stream,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
        }
        else {
          writeToFileCon(this,(FILE *)__stream,HVar15);
        }
        writeToFile(this,(FILE *)__stream,pcVar11);
        HighsSparseMatrix::HighsSparseMatrix(&local_180,&local_2b0);
        this_00 = &local_3b8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00,__x);
        ar_matrix_00 = &local_180;
        writeToFileMatrixRow(this,(FILE *)__stream,HVar15,ar_matrix_00,this_00);
        pcVar11 = " <=";
        pvVar13 = pvVar2;
        goto LAB_0021eb06;
      }
    }
    else {
      if (lVar10 == lVar8) {
        std::__cxx11::string::string
                  ((string *)&local_2f0,
                   (string *)
                   ((long)&(((model->lp_).row_names_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12)
                  );
        writeToFileVar(this,(FILE *)__stream,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      else {
        writeToFileCon(this,(FILE *)__stream,HVar15);
      }
      writeToFile(this,(FILE *)__stream,":");
      HighsSparseMatrix::HighsSparseMatrix(&local_a0,&local_2b0);
      this_00 = &local_388;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00,__x);
      ar_matrix_00 = &local_a0;
      writeToFileMatrixRow(this,(FILE *)__stream,HVar15,ar_matrix_00,this_00);
      pcVar11 = " =";
      pvVar13 = pvVar1;
LAB_0021eb06:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      HighsSparseMatrix::~HighsSparseMatrix(ar_matrix_00);
      writeToFile(this,(FILE *)__stream,pcVar11);
      writeToFile(this,(FILE *)__stream," %+.15g",
                  (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar14]);
      writeToFileLineend(this,(FILE *)__stream);
    }
    lVar12 = lVar12 + 0x20;
  }
  writeToFile(this,(FILE *)__stream,"bounds");
  writeToFileLineend(this,(FILE *)__stream);
  lVar10 = 0;
  lVar8 = 0;
  do {
    if ((model->lp_).num_col_ <= lVar8) {
      if ((model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (model->lp_).integrality_.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar8 = 0;
        writeToFile(this,(FILE *)__stream,"bin");
        writeToFileLineend(this,(FILE *)__stream);
        for (lVar10 = 0; lVar10 < (model->lp_).num_col_; lVar10 = lVar10 + 1) {
          if (((((model->lp_).integrality_.
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10] == kInteger) &&
               (dVar17 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10], dVar17 == 0.0)) &&
              (!NAN(dVar17))) &&
             ((dVar17 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar10], dVar17 == 1.0 &&
              (!NAN(dVar17))))) {
            if (lVar6 == lVar7) {
              std::__cxx11::string::string
                        ((string *)&local_200,
                         (string *)
                         ((long)&(((__x->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8));
              writeToFileVar(this,(FILE *)__stream,&local_200);
              std::__cxx11::string::~string((string *)&local_200);
            }
            else {
              writeToFileVar(this,(FILE *)__stream,(HighsInt)lVar10);
            }
            writeToFileLineend(this,(FILE *)__stream);
          }
          lVar8 = lVar8 + 0x20;
        }
        lVar8 = 0;
        writeToFile(this,(FILE *)__stream,"gen");
        writeToFileLineend(this,(FILE *)__stream);
        for (lVar10 = 0; lVar10 < (model->lp_).num_col_; lVar10 = lVar10 + 1) {
          if (((model->lp_).integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] == kInteger) &&
             (((dVar17 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10], dVar17 != 0.0 ||
               (NAN(dVar17))) ||
              ((dVar17 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10], dVar17 != 1.0 ||
               (NAN(dVar17))))))) {
            if (lVar6 == lVar7) {
              std::__cxx11::string::string
                        ((string *)&local_220,
                         (string *)
                         ((long)&(((__x->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8));
              writeToFileVar(this,(FILE *)__stream,&local_220);
              std::__cxx11::string::~string((string *)&local_220);
            }
            else {
              writeToFileVar(this,(FILE *)__stream,(HighsInt)lVar10);
            }
            writeToFileLineend(this,(FILE *)__stream);
          }
          lVar8 = lVar8 + 0x20;
        }
        lVar8 = 0;
        writeToFile(this,(FILE *)__stream,"semi");
        writeToFileLineend(this,(FILE *)__stream);
        for (lVar10 = 0; lVar10 < (model->lp_).num_col_; lVar10 = lVar10 + 1) {
          if (((model->lp_).integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] & ~kInteger) == kSemiContinuous) {
            if (lVar6 == lVar7) {
              std::__cxx11::string::string
                        ((string *)&local_240,
                         (string *)
                         ((long)&(((__x->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8));
              writeToFileVar(this,(FILE *)__stream,&local_240);
              std::__cxx11::string::~string((string *)&local_240);
            }
            else {
              writeToFileVar(this,(FILE *)__stream,(HighsInt)lVar10);
            }
            writeToFileLineend(this,(FILE *)__stream);
          }
          lVar8 = lVar8 + 0x20;
        }
      }
      writeToFile(this,(FILE *)__stream,"end");
      writeToFileLineend(this,(FILE *)__stream);
      fclose(__stream);
      HighsSparseMatrix::~HighsSparseMatrix(&local_2b0);
      return kOk;
    }
    pdVar3 = (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar17 = (model->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
    if (((dVar17 != 0.0) || (NAN(dVar17))) || (pdVar3[lVar8] < INFINITY)) {
      dVar18 = pdVar3[lVar8];
      HVar15 = (HighsInt)lVar8;
      if ((-INFINITY < dVar17) || (dVar18 < INFINITY)) {
        if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            writeToFile(this,(FILE *)__stream," %.15g");
            writeToFile(this,(FILE *)__stream," <=");
          }
          if (lVar6 == lVar7) {
            std::__cxx11::string::string
                      ((string *)&local_370,
                       (string *)
                       ((long)&(((__x->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar10));
            writeToFileVar(this,(FILE *)__stream,&local_370);
            std::__cxx11::string::~string((string *)&local_370);
          }
          else {
            writeToFileVar(this,(FILE *)__stream,HVar15);
          }
          if ((model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] == INFINITY) goto LAB_0021eded;
          pcVar11 = " <=";
        }
        else {
          if (lVar6 == lVar7) {
            std::__cxx11::string::string
                      ((string *)&local_350,
                       (string *)
                       ((long)&(((__x->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar10));
            writeToFileVar(this,(FILE *)__stream,&local_350);
            std::__cxx11::string::~string((string *)&local_350);
          }
          else {
            writeToFileVar(this,(FILE *)__stream,HVar15);
          }
          pcVar11 = " =";
        }
        writeToFile(this,(FILE *)__stream,pcVar11);
        writeToFile(this,(FILE *)__stream," %.15g",
                    (model->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar8]);
      }
      else {
        if (lVar6 == lVar7) {
          std::__cxx11::string::string
                    ((string *)&local_1e0,
                     (string *)
                     ((long)&(((__x->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar10));
          writeToFileVar(this,(FILE *)__stream,&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
        }
        else {
          writeToFileVar(this,(FILE *)__stream,HVar15);
        }
        writeToFile(this,(FILE *)__stream," free");
      }
LAB_0021eded:
      writeToFileLineend(this,(FILE *)__stream);
    }
    lVar8 = lVar8 + 1;
    lVar10 = lVar10 + 0x20;
  } while( true );
}

Assistant:

HighsStatus FilereaderLp::writeModelToFile(const HighsOptions& options,
                                           const std::string filename,
                                           const HighsModel& model) {
  const HighsLp& lp = model.lp_;
  // Create a row-wise copy of the matrix
  HighsSparseMatrix ar_matrix = lp.a_matrix_;
  ar_matrix.ensureRowwise();

  const bool has_col_names =
      allow_model_names &&
      lp.col_names_.size() == static_cast<size_t>(lp.num_col_);
  const bool has_row_names =
      allow_model_names &&
      lp.row_names_.size() == static_cast<size_t>(lp.num_row_);
  FILE* file = fopen(filename.c_str(), "w");

  // write comment at the start of the file
  this->writeToFile(file, "\\ %s", LP_COMMENT_FILESTART);
  this->writeToFileLineend(file);

  // write objective
  this->writeToFile(file, "%s",
                    lp.sense_ == ObjSense::kMinimize ? "min" : "max");
  this->writeToFileLineend(file);
  this->writeToFile(file, " obj:");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double coef = lp.col_cost_[iCol];
    if (coef != 0.0) {
      this->writeToFileValue(file, coef);
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
    }
  }
  this->writeToFile(file,
                    " ");  // ToDo Unnecessary, but only to give empty diff
  if (model.isQp()) {
    this->writeToFile(file, "+ [");
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      for (HighsInt iEl = model.hessian_.start_[iCol];
           iEl < model.hessian_.start_[iCol + 1]; iEl++) {
        HighsInt iRow = model.hessian_.index_[iEl];
        if (iCol <= iRow) {
          double coef = model.hessian_.value_[iEl];
          if (iCol != iRow) coef *= 2;
          if (coef != 0.0) {
            this->writeToFileValue(file, coef);
            if (has_col_names) {
              this->writeToFileVar(file, lp.col_names_[iCol]);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, lp.col_names_[iRow]);
            } else {
              this->writeToFileVar(file, iCol);
              this->writeToFile(file, " *");
              this->writeToFileVar(file, iRow);
            }
          }
        }
      }
    }
    this->writeToFile(file,
                      "  ]/2 ");  // ToDo Surely needs only to be one space
  }
  double coef = lp.offset_;
  if (coef != 0) this->writeToFileValue(file, coef);
  this->writeToFileLineend(file);

  // write constraint section, lower & upper bounds are one constraint
  // each
  this->writeToFile(file, "st");
  this->writeToFileLineend(file);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (lp.row_lower_[iRow] == lp.row_upper_[iRow]) {
      // Equality constraint
      if (has_row_names) {
        this->writeToFileVar(file, lp.row_names_[iRow]);
      } else {
        this->writeToFileCon(file, iRow);
      }
      this->writeToFile(file, ":");
      this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.row_lower_[iRow], true);
      this->writeToFileLineend(file);
    } else {
      // Need to distinguish the names when writing out boxed
      // constraint row as two single-sided constraints
      const bool boxed =
          lp.row_lower_[iRow] > -kHighsInf && lp.row_upper_[iRow] < kHighsInf;
      if (lp.row_lower_[iRow] > -kHighsInf) {
        // Has a lower bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "lo:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " >=");
        this->writeToFileValue(file, lp.row_lower_[iRow], true);
        this->writeToFileLineend(file);
      }
      if (lp.row_upper_[iRow] < kHighsInf) {
        // Has an upper bound
        if (has_row_names) {
          this->writeToFileVar(file, lp.row_names_[iRow]);
        } else {
          this->writeToFileCon(file, iRow);
        }
        if (boxed) {
          this->writeToFile(file, "up:");
        } else {
          this->writeToFile(file, ":");
        }
        this->writeToFileMatrixRow(file, iRow, ar_matrix, lp.col_names_);
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.row_upper_[iRow], true);
        this->writeToFileLineend(file);
      }
    }
  }

  // write bounds section
  this->writeToFile(file, "bounds");
  this->writeToFileLineend(file);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const bool default_bounds =
        lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == kHighsInf;
    if (default_bounds) continue;
    if (lp.col_lower_[iCol] <= -kHighsInf && lp.col_upper_[iCol] >= kHighsInf) {
      // Free variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " free");
    } else if (lp.col_lower_[iCol] == lp.col_upper_[iCol]) {
      // Fixed variable
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      this->writeToFile(file, " =");
      this->writeToFileValue(file, lp.col_upper_[iCol], false);
    } else {
      assert(!default_bounds);
      // Non-default bound
      if (lp.col_lower_[iCol] != 0) {
        // Nonzero lower bound
        this->writeToFileValue(file, lp.col_lower_[iCol], false);
        this->writeToFile(file, " <=");
      }
      if (has_col_names) {
        this->writeToFileVar(file, lp.col_names_[iCol]);
      } else {
        this->writeToFileVar(file, iCol);
      }
      if (lp.col_upper_[iCol] < kHighsInf) {
        // Finite upper bound
        this->writeToFile(file, " <=");
        this->writeToFileValue(file, lp.col_upper_[iCol], false);
      }
    }
    this->writeToFileLineend(file);
  }
  if (lp.integrality_.size() > 0) {
    // write binary section
    this->writeToFile(file, "bin");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0.0 && lp.col_upper_[iCol] == 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write general section
    this->writeToFile(file, "gen");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] != 0.0 || lp.col_upper_[iCol] != 1.0) {
          if (has_col_names) {
            this->writeToFileVar(file, lp.col_names_[iCol]);
          } else {
            this->writeToFileVar(file, iCol);
          }
          this->writeToFileLineend(file);
        }
      }
    }

    // write semi section
    this->writeToFile(file, "semi");
    this->writeToFileLineend(file);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
          lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        if (has_col_names) {
          this->writeToFileVar(file, lp.col_names_[iCol]);
        } else {
          this->writeToFileVar(file, iCol);
        }
        this->writeToFileLineend(file);
      }
    }
  }
  // write end
  this->writeToFile(file, "end");
  this->writeToFileLineend(file);

  fclose(file);
  return HighsStatus::kOk;
}